

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaCompareReplaceCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  
  while ((uVar3 = (ulong)*y, uVar3 < 0x21 && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  bVar1 = *x;
  while( true ) {
    bVar2 = (byte)uVar3;
    if (bVar1 == 0) break;
    if (bVar2 < 0x21) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 != 0) goto LAB_001d4481;
      }
      else {
        if ((bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          do {
            y = y + 1;
            if (0x20 < (ulong)*y) break;
          } while ((0x100002600U >> ((ulong)*y & 0x3f) & 1) != 0);
          goto LAB_001d4499;
        }
        if (bVar1 < 0x20) goto LAB_001d44cf;
      }
LAB_001d44da:
      bVar4 = invert != 0;
      goto LAB_001d44de;
    }
LAB_001d4481:
    if ((bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      if (bVar2 < 0x21) goto LAB_001d44da;
      goto LAB_001d44cf;
    }
    if (bVar1 < bVar2) {
      return -1;
    }
    if (bVar1 != bVar2) {
      return 1;
    }
    y = y + 1;
LAB_001d4499:
    bVar1 = x[1];
    x = x + 1;
    uVar3 = (ulong)*y;
  }
  if (bVar2 == 0) {
    return 0;
  }
  do {
    y = y + 1;
    if (0x20 < (byte)uVar3) {
LAB_001d44cf:
      bVar4 = invert == 0;
LAB_001d44de:
      return -(uint)bVar4 | 1;
    }
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0) {
        return 0;
      }
      goto LAB_001d44cf;
    }
    uVar3 = (ulong)*y;
  } while( true );
}

Assistant:

static int
xmlSchemaCompareReplaceCollapseStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_BLANK_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    if IS_WSP_BLANK_CH(*x) {
		/*
		* The xv character would have been replaced to 0x20.
		*/
		if ((0x20 - *y) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	 if (invert)
	     return(-1);
	 else
	     return(1);
    }
    if (*y != 0) {
	/*
	* Skip trailing blank chars of the collapsed string.
	*/
	while IS_WSP_BLANK_CH(*y)
	    y++;
	if (*y != 0) {
	    if (invert)
		return(1);
	    else
		return(-1);
	}
    }
    return(0);
}